

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O0

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  uint uVar1;
  ring_buffer_size_t rVar2;
  undefined8 local_58;
  OceanWave *ptr;
  float *out;
  paTestData *data;
  void *pvStack_38;
  int i;
  void *userData_local;
  PaStreamCallbackFlags statusFlags_local;
  PaStreamCallbackTimeInfo *timeInfo_local;
  unsigned_long framesPerBuffer_local;
  void *outputBuffer_local;
  void *inputBuffer_local;
  
  ptr = (OceanWave *)outputBuffer;
  out = (float *)userData;
  pvStack_38 = userData;
  userData_local = (void *)statusFlags;
  statusFlags_local = (PaStreamCallbackFlags)timeInfo;
  timeInfo_local = (PaStreamCallbackTimeInfo *)framesPerBuffer;
  framesPerBuffer_local = (unsigned_long)outputBuffer;
  outputBuffer_local = inputBuffer;
  memset(outputBuffer,0,framesPerBuffer << 3);
  for (data._4_4_ = 0; data._4_4_ < 0x10; data._4_4_ = data._4_4_ + 1) {
    if ((*(long *)(out + (long)data._4_4_ * 2) == 0) &&
       (rVar2 = PaUtil_GetRingBufferReadAvailable((PaUtilRingBuffer *)(out + 0x22)), rVar2 != 0)) {
      local_58 = 0;
      PaUtil_ReadRingBuffer((PaUtilRingBuffer *)(out + 0x22),&local_58,1);
      *(undefined8 *)(out + (long)data._4_4_ * 2) = local_58;
    }
    if ((*(long *)(out + (long)data._4_4_ * 2) != 0) &&
       (uVar1 = GenerateWave(*(OceanWave **)(out + (long)data._4_4_ * 2),(float *)ptr,
                             (uint)timeInfo_local), uVar1 != 0)) {
      PaUtil_WriteRingBuffer((PaUtilRingBuffer *)(out + 0x32),out + (long)data._4_4_ * 2,1);
      (out + (long)data._4_4_ * 2)[0] = 0.0;
      (out + (long)data._4_4_ * 2)[1] = 0.0;
    }
  }
  return 0;
}

Assistant:

static int patestCallback(const void*                     inputBuffer,
                          void*                           outputBuffer,
                          unsigned long                   framesPerBuffer,
			              const PaStreamCallbackTimeInfo* timeInfo,
			              PaStreamCallbackFlags           statusFlags,
                          void*                           userData)
{
    int i;
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    (void) inputBuffer; /* Prevent "unused variable" warnings. */

    /* Reset output data first */
    memset(out, 0, framesPerBuffer * 2 * sizeof(float));

    for (i = 0; i < 16; ++i)
    {
        /* Consume the input queue */
        if (data->waves[i] == 0 && PaUtil_GetRingBufferReadAvailable(&data->rBufToRT))
        {
            OceanWave* ptr = 0;
            PaUtil_ReadRingBuffer(&data->rBufToRT, &ptr, 1);
            data->waves[i] = ptr;
        }

        if (data->waves[i] != 0)
        {
            if (GenerateWave(data->waves[i], out, framesPerBuffer))
            {
                /* If wave is "done", post it back to the main thread for deletion */
                PaUtil_WriteRingBuffer(&data->rBufFromRT, &data->waves[i], 1);
                data->waves[i] = 0;
            }
        }
    }
    return paContinue;
}